

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O1

void __thiscall pbrt::MetalMaterial::MetalMaterial(MetalMaterial *this,string *name)

{
  Material::Material(&this->super_Material,name);
  (this->super_Material).super_Entity._vptr_Entity = (_func_int **)&PTR_toString_abi_cxx11__001674d0
  ;
  this->roughness = 0.01;
  (this->map_vRoughness).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->map_vRoughness).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->map_roughness).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->map_roughness).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->uRoughness = 0.0;
  (this->map_uRoughness).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->map_uRoughness).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->vRoughness = 0.0;
  this->remapRoughness = true;
  (this->eta).x = 0.21221054;
  (this->eta).y = 0.91804785;
  (this->eta).z = 1.1000715;
  (this->spectrum_eta).super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->spectrum_eta).super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->spectrum_eta).super_Entity._vptr_Entity = (_func_int **)&PTR_toString_abi_cxx11__00167490;
  (this->spectrum_eta).spd.
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->spectrum_eta).spd.
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->spectrum_eta).spd.
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->k).x = 3.9132357;
  (this->k).y = 2.4519274;
  (this->k).z = 2.1321275;
  (this->spectrum_k).super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->spectrum_k).super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->spectrum_k).super_Entity._vptr_Entity = (_func_int **)&PTR_toString_abi_cxx11__00167490;
  (this->map_bump).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->spectrum_k).spd.
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->map_bump).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->spectrum_k).spd.
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->spectrum_k).spd.
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

MetalMaterial(const std::string &name = "") : Material(name) {}